

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z5;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp3;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_1c8 [16];
  int local_188 [8];
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  int local_108 [8];
  int local_e8 [11];
  int local_bc;
  long local_b8;
  int *local_a8;
  short *local_a0;
  short *local_98;
  JSAMPLE dcval_1;
  int dcval;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_b8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_a0 = *(short **)(in_RSI + 0x58);
  local_a8 = local_1c8;
  local_98 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_bc = 8; 0 < local_bc; local_bc = local_bc + -1) {
    if ((((local_98[8] == 0) && (local_98[0x10] == 0)) &&
        ((local_98[0x18] == 0 &&
         (((local_98[0x20] == 0 && (local_98[0x28] == 0)) && (local_98[0x30] == 0)))))) &&
       (local_98[0x38] == 0)) {
      iVar2 = (int)*local_98 * (int)*local_a0 * 4;
      *local_a8 = iVar2;
      local_a8[8] = iVar2;
      local_a8[0x10] = iVar2;
      local_a8[0x18] = iVar2;
      local_a8[0x20] = iVar2;
      local_a8[0x28] = iVar2;
      local_a8[0x30] = iVar2;
      local_a8[0x38] = iVar2;
    }
    else {
      lVar3 = ((long)((int)local_98[0x10] * (int)local_a0[0x10]) +
              (long)((int)local_98[0x30] * (int)local_a0[0x30])) * 0x1151;
      lVar4 = lVar3 + (long)((int)local_98[0x30] * (int)local_a0[0x30]) * -0x3b21;
      lVar3 = lVar3 + (long)((int)local_98[0x10] * (int)local_a0[0x10]) * 0x187e;
      local_68 = ((long)((int)*local_98 * (int)*local_a0) +
                 (long)((int)local_98[0x20] * (int)local_a0[0x20])) * 0x2000;
      local_60 = ((long)((int)*local_98 * (int)*local_a0) -
                 (long)((int)local_98[0x20] * (int)local_a0[0x20])) * 0x2000;
      local_50 = local_68 + lVar3;
      local_68 = local_68 - lVar3;
      local_58 = local_60 + lVar4;
      local_60 = local_60 - lVar4;
      lVar4 = (long)((int)local_98[0x38] * (int)local_a0[0x38]);
      lVar3 = (long)((int)local_98[0x28] * (int)local_a0[0x28]);
      lVar5 = (long)((int)local_98[0x18] * (int)local_a0[0x18]);
      lVar6 = (long)((int)local_98[8] * (int)local_a0[8]);
      lVar7 = (lVar4 + lVar5 + lVar3 + lVar6) * 0x25a1;
      lVar8 = (lVar4 + lVar6) * -0x1ccd;
      lVar9 = (lVar3 + lVar5) * -0x5203;
      lVar10 = lVar7 + (lVar4 + lVar5) * -0x3ec5;
      lVar7 = lVar7 + (lVar3 + lVar6) * -0xc7c;
      local_30 = lVar8 + lVar10 + lVar4 * 0x98e;
      local_38 = lVar9 + lVar7 + lVar3 * 0x41b3;
      local_40 = lVar9 + lVar10 + lVar5 * 0x6254;
      local_48 = lVar8 + lVar7 + lVar6 * 0x300b;
      *local_a8 = (int)(local_50 + local_48 + 0x400 >> 0xb);
      local_a8[0x38] = (int)((local_50 - local_48) + 0x400 >> 0xb);
      local_a8[8] = (int)(local_58 + local_40 + 0x400 >> 0xb);
      local_a8[0x30] = (int)((local_58 - local_40) + 0x400 >> 0xb);
      local_a8[0x10] = (int)(local_60 + local_38 + 0x400 >> 0xb);
      local_a8[0x28] = (int)((local_60 - local_38) + 0x400 >> 0xb);
      local_a8[0x18] = (int)(local_68 + local_30 + 0x400 >> 0xb);
      local_a8[0x20] = (int)((local_68 - local_30) + 0x400 >> 0xb);
    }
    local_98 = local_98 + 1;
    local_a0 = local_a0 + 1;
    local_a8 = local_a8 + 1;
  }
  local_a8 = local_1c8;
  for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
    puVar11 = (undefined1 *)(*(long *)(local_20 + (long)local_bc * 8) + (ulong)local_24);
    if ((((local_a8[1] == 0) && (local_a8[2] == 0)) && (local_a8[3] == 0)) &&
       (((local_a8[4] == 0 && (local_a8[5] == 0)) && ((local_a8[6] == 0 && (local_a8[7] == 0)))))) {
      uVar1 = *(undefined1 *)(local_b8 + (int)((uint)((long)*local_a8 + 0x10 >> 5) & 0x3ff));
      *puVar11 = uVar1;
      puVar11[1] = uVar1;
      puVar11[2] = uVar1;
      puVar11[3] = uVar1;
      puVar11[4] = uVar1;
      puVar11[5] = uVar1;
      puVar11[6] = uVar1;
      puVar11[7] = uVar1;
    }
    else {
      lVar3 = ((long)local_a8[2] + (long)local_a8[6]) * 0x1151;
      lVar4 = lVar3 + (long)local_a8[6] * -0x3b21;
      lVar3 = lVar3 + (long)local_a8[2] * 0x187e;
      lVar6 = ((long)*local_a8 + (long)local_a8[4]) * 0x2000;
      lVar8 = ((long)*local_a8 - (long)local_a8[4]) * 0x2000;
      lVar5 = lVar6 + lVar3;
      lVar6 = lVar6 - lVar3;
      lVar3 = lVar8 + lVar4;
      lVar8 = lVar8 - lVar4;
      lVar4 = (long)local_a8[7];
      lVar9 = (long)local_a8[5];
      lVar10 = (long)local_a8[3];
      lVar7 = (long)local_a8[1];
      lVar12 = (lVar4 + lVar10 + lVar9 + lVar7) * 0x25a1;
      lVar13 = (lVar4 + lVar7) * -0x1ccd;
      lVar14 = (lVar9 + lVar10) * -0x5203;
      lVar15 = lVar12 + (lVar4 + lVar10) * -0x3ec5;
      lVar12 = lVar12 + (lVar9 + lVar7) * -0xc7c;
      lVar4 = lVar13 + lVar15 + lVar4 * 0x98e;
      lVar9 = lVar14 + lVar12 + lVar9 * 0x41b3;
      lVar10 = lVar14 + lVar15 + lVar10 * 0x6254;
      lVar7 = lVar13 + lVar12 + lVar7 * 0x300b;
      *puVar11 = *(undefined1 *)(local_b8 + (int)((uint)(lVar5 + lVar7 + 0x20000 >> 0x12) & 0x3ff));
      puVar11[7] = *(undefined1 *)
                    (local_b8 + (int)((uint)((lVar5 - lVar7) + 0x20000 >> 0x12) & 0x3ff));
      puVar11[1] = *(undefined1 *)
                    (local_b8 + (int)((uint)(lVar3 + lVar10 + 0x20000 >> 0x12) & 0x3ff));
      puVar11[6] = *(undefined1 *)
                    (local_b8 + (int)((uint)((lVar3 - lVar10) + 0x20000 >> 0x12) & 0x3ff));
      puVar11[2] = *(undefined1 *)
                    (local_b8 + (int)((uint)(lVar8 + lVar9 + 0x20000 >> 0x12) & 0x3ff));
      puVar11[5] = *(undefined1 *)
                    (local_b8 + (int)((uint)((lVar8 - lVar9) + 0x20000 >> 0x12) & 0x3ff));
      puVar11[3] = *(undefined1 *)
                    (local_b8 + (int)((uint)(lVar6 + lVar4 + 0x20000 >> 0x12) & 0x3ff));
      puVar11[4] = *(undefined1 *)
                    (local_b8 + (int)((uint)((lVar6 - lVar4) + 0x20000 >> 0x12) & 0x3ff));
    }
    local_a8 = local_a8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);

    tmp0 = LEFT_SHIFT(z2 + z3, CONST_BITS);
    tmp1 = LEFT_SHIFT(z2 - z3, CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE * 0] = (int)DESCALE(tmp10 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 7] = (int)DESCALE(tmp10 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 1] = (int)DESCALE(tmp11 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 6] = (int)DESCALE(tmp11 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 2] = (int)DESCALE(tmp12 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 5] = (int)DESCALE(tmp12 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 3] = (int)DESCALE(tmp13 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 4] = (int)DESCALE(tmp13 - tmp0, CONST_BITS - PASS1_BITS);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0] + (JLONG)wsptr[4], CONST_BITS);
    tmp1 = LEFT_SHIFT((JLONG)wsptr[0] - (JLONG)wsptr[4], CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (JLONG)wsptr[7];
    tmp1 = (JLONG)wsptr[5];
    tmp2 = (JLONG)wsptr[3];
    tmp3 = (JLONG)wsptr[1];

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)DESCALE(tmp10 - tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp11 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)DESCALE(tmp11 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 + tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)DESCALE(tmp12 - tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp13 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)DESCALE(tmp13 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}